

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KruskalMST.h
# Opt level: O0

double __thiscall KruskalMST::operator()(KruskalMST *this)

{
  bool bVar1;
  reference pEVar2;
  ulong uVar3;
  UFS *in_RDI;
  Edge *edge;
  const_iterator __end1;
  const_iterator __begin1;
  vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_> *__range1;
  UFS ufs;
  int need;
  double ans;
  vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_> *in_stack_ffffffffffffff88;
  __normal_iterator<const_KruskalMST::Edge_*,_std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>_>
  *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffac;
  UFS *in_stack_ffffffffffffffb0;
  __normal_iterator<const_KruskalMST::Edge_*,_std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>_>
  local_38 [2];
  UFS local_28;
  uint local_14;
  double local_10;
  
  local_10 = 0.0;
  local_14 = *(uint *)&in_RDI[1].fa._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl;
  uVar3 = (ulong)local_14;
  UFS::UFS(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  local_38[0]._M_current =
       (Edge *)std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>::begin
                         (in_stack_ffffffffffffff88);
  std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff90,
                            (__normal_iterator<const_KruskalMST::Edge_*,_std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_KruskalMST::Edge_*,_std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>_>
             ::operator*(local_38);
    bVar1 = UFS::connected(in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    in_stack_ffffffffffffff9c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c);
    if (!bVar1) {
      UFS::connect(&local_28,pEVar2->from,(sockaddr *)(ulong)(uint)pEVar2->to,(socklen_t)uVar3);
      local_10 = pEVar2->w + local_10;
      local_14 = local_14 - 1;
      if (local_14 == 1) break;
    }
    __gnu_cxx::
    __normal_iterator<const_KruskalMST::Edge_*,_std::vector<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>_>
    ::operator++(local_38);
  }
  UFS::~UFS((UFS *)0x108634);
  return local_10;
}

Assistant:

double operator()() const
	{
		double ans = 0.0;
		int need = n;
		UFS ufs(n);
		for (auto &edge : edges)
		{
			if (!ufs.connected(edge.from, edge.to))
			{
				ufs.connect(edge.from, edge.to);
				ans += edge.w;
				if (--need == 1)
					break;
			}
		}
		return ans;
	}